

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

void __thiscall
GameEngine::fillMapPattern
          (GameEngine *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *cells)

{
  cellType cVar1;
  size_t sVar2;
  size_t sVar3;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar4;
  ulong uVar5;
  element_type *this_00;
  long lVar6;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> local_48;
  
  this_00 = (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (element_type *)0x0) {
    generateMap(this);
    this_00 = (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  sVar2 = Map::getHeight(this_00);
  sVar3 = Map::getWidth((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::vector<int,_std::allocator<int>_>::vector(&local_48,sVar3,&local_49);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_fill_assign(cells,sVar2,&local_48);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  sVar2 = Map::getHeight((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (sVar2 != 0) {
    sVar2 = 0;
    do {
      sVar3 = Map::getWidth((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (sVar3 != 0) {
        lVar6 = 0;
        uVar5 = 0;
        do {
          pvVar4 = Map::operator[]((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr,sVar2);
          cVar1 = CellType::getType(*(CellType **)
                                     ((long)&(((pvVar4->
                                               super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>
                                             )._M_ptr + lVar6));
          *(cellType *)
           (*(long *)&(cells->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[sVar2].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           + uVar5 * 4) = cVar1;
          uVar5 = uVar5 + 1;
          sVar3 = Map::getWidth((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
          lVar6 = lVar6 + 0x10;
        } while (uVar5 < sVar3);
      }
      sVar2 = sVar2 + 1;
      sVar3 = Map::getHeight((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
    } while (sVar2 < sVar3);
  }
  return;
}

Assistant:

void GameEngine::fillMapPattern(std::vector<std::vector<int32_t> > &cells) {
  if (map == nullptr) {
    generateMap();
  }

  cells.assign(map->getHeight(), std::vector<int32_t>(map->getWidth()));

  for (size_t row = 0; row < map->getHeight(); ++row) {
    for (size_t column = 0; column < map->getWidth(); ++column) {
      cells[row][column] = static_cast<int32_t>((*map)[row][column]->getType());
    }
  }
}